

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

GPU_AttributeFormat *
GPU_MakeAttributeFormat
          (GPU_AttributeFormat *__return_storage_ptr__,int num_elems_per_vertex,GPU_TypeEnum type,
          _Bool normalize,int stride_bytes,int offset_bytes)

{
  __return_storage_ptr__->is_per_sprite = false;
  __return_storage_ptr__->num_elems_per_value = num_elems_per_vertex;
  __return_storage_ptr__->type = type;
  __return_storage_ptr__->normalize = normalize;
  __return_storage_ptr__->stride_bytes = stride_bytes;
  __return_storage_ptr__->offset_bytes = offset_bytes;
  return __return_storage_ptr__;
}

Assistant:

GPU_AttributeFormat GPU_MakeAttributeFormat(int num_elems_per_vertex, GPU_TypeEnum type, GPU_bool normalize, int stride_bytes, int offset_bytes)
{
    GPU_AttributeFormat f;
    f.is_per_sprite = GPU_FALSE;
    f.num_elems_per_value = num_elems_per_vertex;
    f.type = type;
    f.normalize = normalize;
    f.stride_bytes = stride_bytes;
    f.offset_bytes = offset_bytes;
    return f;
}